

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.cpp
# Opt level: O2

Polynom<Complex> __thiscall Polynom<Complex>::ordinalAdd(Polynom<Complex> *this,Polynom<Complex> *a)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  matrix_error *this_00;
  Matrix<Complex> *in_RDX;
  Complex *extraout_RDX;
  Complex *pCVar5;
  Complex *extraout_RDX_00;
  Complex *extraout_RDX_01;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  Matrix<Complex> *a_00;
  Polynom<Complex> PVar9;
  Complex local_b0;
  
  bVar1 = isOrdinal(a);
  if ((!bVar1) || (bVar1 = isOrdinal((Polynom<Complex> *)in_RDX), !bVar1)) {
    this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
    matrix_error::runtime_error(this_00,"Invalid ordinal");
    __cxa_throw(this_00,&matrix_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = degree((Polynom<Complex> *)in_RDX);
  a_00 = &a->m;
  if (-1 < iVar2) {
    iVar2 = degree(a);
    iVar3 = degree((Polynom<Complex> *)in_RDX);
    a_00 = in_RDX;
    if (-1 < iVar2 - iVar3) {
      iVar4 = degree(a);
      Polynom(this,iVar4 + 1);
      uVar7 = (ulong)(uint)(iVar2 - iVar3);
      for (lVar6 = 0; uVar7 * 0x80 != lVar6; lVar6 = lVar6 + 0x80) {
        Complex::operator=((Complex *)
                           ((long)&(((this->m).arr)->_re)._numerator.digits.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar6),
                           (Complex *)
                           ((long)&(((a->m).arr)->_re)._numerator.digits.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar6));
      }
      ::operator+(&local_b0,(a->m).arr + uVar7,in_RDX->arr);
      Complex::operator=((this->m).arr + uVar7,&local_b0);
      Complex::~Complex(&local_b0);
      lVar6 = 0x80;
      pCVar5 = extraout_RDX;
      uVar8 = uVar7;
      while (uVar8 = uVar8 + 1, uVar8 < (this->m).N) {
        Complex::operator=((Complex *)
                           ((long)&(this->m).arr[uVar7]._re._numerator.digits.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar6),
                           (Complex *)
                           ((long)&(in_RDX->arr->_re)._numerator.digits.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar6));
        lVar6 = lVar6 + 0x80;
        pCVar5 = extraout_RDX_00;
      }
      goto LAB_00133f0b;
    }
  }
  Matrix<Complex>::Matrix(&this->m,a_00);
  pCVar5 = extraout_RDX_01;
LAB_00133f0b:
  PVar9.m.arr = pCVar5;
  PVar9.m._0_8_ = this;
  return (Polynom<Complex>)PVar9.m;
}

Assistant:

const Polynom<Field> Polynom<Field>::ordinalAdd(const Polynom &a) const
{
    if(!isOrdinal() || !a.isOrdinal())
        throw matrix_error("Invalid ordinal");
    if(a.degree() < 0)
        return *this;
    int degdiff = degree() - a.degree();
    if(degdiff < 0)
        return a;
    Polynom x(degree() + 1);
    for(int i = 0; i < degdiff; ++i)
    {
        x.m[0][i] = m[0][i];
    }
    x.m[0][degdiff] = m[0][degdiff] + a.m[0][0];
    for(unsigned i = degdiff + 1; i < x.m.width(); ++i)
    {
        x.m[0][i] = a.m[0][i - degdiff];
    }
    return x;
}